

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O0

int nn_rep_send(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  nn_sockbase *in_RSI;
  nn_chunkref *in_RDI;
  nn_rep *rep;
  int rc;
  int in_stack_ffffffffffffffbc;
  nn_chunkref *in_stack_ffffffffffffffc0;
  FILE *__stream;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  nn_chunkref *dst;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  if (in_RDI == (nn_chunkref *)0x0) {
    in_RDI = (nn_chunkref *)0x0;
  }
  if (((undefined1  [32])in_RDI[0xd].u & (undefined1  [32])0x1) == (undefined1  [32])0x0) {
    local_4 = -0x9523dfe;
  }
  else {
    dst = in_RDI;
    sVar2 = nn_chunkref_size(in_stack_ffffffffffffffc0);
    if (sVar2 != 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/rep.c"
              ,0x66);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_chunkref_term(in_stack_ffffffffffffffc0);
    nn_chunkref_mv(dst,(nn_chunkref *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8))
    ;
    *(uint *)((long)&in_RDI[0xd].u + 0x10) = *(uint *)((long)&in_RDI[0xd].u + 0x10) & 0xfffffffe;
    iVar1 = nn_xrep_send(in_RSI,(nn_msg *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (iVar1 != 0 && iVar1 != -0xb) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar3 = nn_err_strerror(in_stack_ffffffffffffffbc);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/rep.c"
              ,0x6e);
      fflush(_stderr);
      nn_err_abort();
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_rep_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_rep *rep;

    rep = nn_cont (self, struct nn_rep, xrep.sockbase);

    /*  If no request was received, there's nowhere to send the reply to. */
    if (nn_slow (!(rep->flags & NN_REP_INPROGRESS)))
        return -EFSM;

    /*  Move the stored backtrace into the message header. */
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &rep->backtrace);
    rep->flags &= ~NN_REP_INPROGRESS;

    /*  Send the reply. If it cannot be sent because of pushback,
        drop it silently. */
    rc = nn_xrep_send (&rep->xrep.sockbase, msg);
    errnum_assert (rc == 0 || rc == -EAGAIN, -rc);

    return 0;
}